

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O0

int dump_indent(size_t flags,int depth,int space,json_dump_callback_t dump,void *data)

{
  uint uVar1;
  int iVar2;
  uint local_38;
  int cur_n;
  uint n_spaces;
  uint ws_count;
  void *data_local;
  json_dump_callback_t dump_local;
  int space_local;
  int depth_local;
  size_t flags_local;
  
  if ((flags & 0x1f) == 0) {
    if ((space != 0) && ((flags & 0x20) == 0)) {
      iVar2 = (*dump)(" ",1,data);
      return iVar2;
    }
  }
  else {
    local_38 = depth * ((uint)flags & 0x1f);
    iVar2 = (*dump)("\n",1,data);
    if (iVar2 != 0) {
      return -1;
    }
    for (; local_38 != 0; local_38 = local_38 - uVar1) {
      uVar1 = local_38;
      if (0x1f < local_38) {
        uVar1 = 0x20;
      }
      iVar2 = (*dump)("                                ",(long)(int)uVar1,data);
      if (iVar2 != 0) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

static int dump_indent(size_t flags, int depth, int space, json_dump_callback_t dump, void *data)
{
	if (FLAGS_TO_INDENT(flags) > 0)
	{
		unsigned int ws_count = FLAGS_TO_INDENT(flags), n_spaces = depth * ws_count;

		if (dump("\n", 1, data))
			return -1;

		while (n_spaces > 0)
		{
			int cur_n = n_spaces < sizeof whitespace - 1 ? n_spaces : sizeof whitespace - 1;

			if (dump(whitespace, cur_n, data))
				return -1;

			n_spaces -= cur_n;
		}
	}
	else if (space && !(flags & JSON_COMPACT))
	{
		return dump(" ", 1, data);
	}
	return 0;
}